

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O0

void __thiscall wasm::ReFinalize::visitBlock(ReFinalize *this,Block *curr)

{
  bool bVar1;
  size_t sVar2;
  pointer ppVar3;
  Type TVar4;
  Expression **ppEVar5;
  pair<std::__detail::_Node_iterator<wasm::Type,_true,_true>,_bool> pVar6;
  Type local_98;
  BasicType local_8c;
  Expression *local_88;
  Expression *child;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  _Node_iterator_base<wasm::Type,_true> local_48;
  undefined1 local_40;
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  *local_38;
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  *types;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
  local_28;
  iterator iter;
  Block *curr_local;
  ReFinalize *this_local;
  
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar2 == 0) {
    wasm::Type::Type((Type *)&iter,none);
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
         (uintptr_t)
         iter.
         super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
         ._M_cur;
  }
  else {
    bVar1 = IString::is(&(curr->name).super_IString);
    if (bVar1) {
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
           ::find(&this->breakTypes,&curr->name);
      types = (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
               *)std::
                 unordered_map<wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
                 ::end(&this->breakTypes);
      bVar1 = std::__detail::operator!=
                        (&local_28,
                         (_Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
                          *)&types);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_false,_true>
                               *)&local_28);
        local_38 = &ppVar3->second;
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(curr->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
        pVar6 = std::
                unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                ::insert(&ppVar3->second,&(*ppEVar5)->type);
        local_48._M_cur =
             (__node_type *)pVar6.first.super__Node_iterator_base<wasm::Type,_true>._M_cur;
        local_40 = pVar6.second;
        TVar4 = wasm::Type::
                getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                          (local_38);
        (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
             TVar4.id;
        return;
      }
    }
    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(curr->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
         ((*ppEVar5)->type).id;
    __range2._4_4_ = 1;
    bVar1 = wasm::Type::operator==
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                        type,(BasicType *)((long)&__range2 + 4));
    if (!bVar1) {
      __range2._0_4_ = 0;
      bVar1 = wasm::Type::operator==
                        (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression
                          .type,(BasicType *)&__range2);
      if (bVar1) {
        join_0x00000010_0x00000000_ =
             ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                       (&(curr->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
        ;
        _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                           (&(curr->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       Iterator::operator!=((Iterator *)&__end2.index,(Iterator *)&child), bVar1) {
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                    operator*((Iterator *)&__end2.index);
          local_88 = *ppEVar5;
          local_8c = unreachable;
          bVar1 = wasm::Type::operator==(&local_88->type,&local_8c);
          if (bVar1) {
            wasm::Type::Type(&local_98,unreachable);
            (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
                 local_98.id;
            return;
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                    ((Iterator *)&__end2.index);
        }
      }
    }
  }
  return;
}

Assistant:

void ReFinalize::visitBlock(Block* curr) {
  if (curr->list.size() == 0) {
    curr->type = Type::none;
    return;
  }
  if (curr->name.is()) {
    auto iter = breakTypes.find(curr->name);
    if (iter != breakTypes.end()) {
      // Set the type to be a supertype of the branch types and the flowed-out
      // type. TODO: calculate proper LUBs to compute a new correct type in this
      // situation.
      auto& types = iter->second;
      types.insert(curr->list.back()->type);
      curr->type = Type::getLeastUpperBound(types);
      return;
    }
  }
  curr->type = curr->list.back()->type;
  if (curr->type == Type::unreachable) {
    return;
  }
  // type is none, but we might be unreachable
  if (curr->type == Type::none) {
    for (auto* child : curr->list) {
      if (child->type == Type::unreachable) {
        curr->type = Type::unreachable;
        break;
      }
    }
  }
}